

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-printing.h
# Opt level: O0

void __thiscall
wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>>::
IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
          (IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>>
           *this,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *fallback,string *prefix)

{
  ulong uVar1;
  size_t __lhs;
  size_type sVar2;
  reference __x;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  TypeNames local_c8;
  pair<const_wasm::HeapType,_wasm::TypeNames> local_80;
  ulong local_30;
  size_t i;
  string *prefix_local;
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *fallback_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types_local;
  IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
  *this_local;
  
  i = (size_t)prefix;
  prefix_local = (string *)fallback;
  fallback_local = (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)types;
  types_local = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this;
  TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
  ::TypeNameGeneratorBase
            ((TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
              *)this);
  DefaultTypeNameGenerator::DefaultTypeNameGenerator((DefaultTypeNameGenerator *)this);
  *(string **)(this + 0x58) = prefix_local;
  std::
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  ::unordered_map((unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                   *)(this + 0x60));
  local_30 = 0;
  while( true ) {
    uVar1 = local_30;
    sVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)fallback_local);
    if (sVar2 <= uVar1) break;
    __x = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)fallback_local,
                     local_30);
    __lhs = i;
    std::__cxx11::to_string(&local_108,local_30);
    std::operator+(&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   &local_108);
    Name::Name(&local_c8.name,&local_e8);
    local_c8.fieldNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_c8.fieldNames._M_h._M_rehash_policy._4_4_ = 0;
    local_c8.fieldNames._M_h._M_rehash_policy._M_next_resize = 0;
    local_c8.fieldNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_c8.fieldNames._M_h._M_element_count = 0;
    local_c8.fieldNames._M_h._M_buckets = (__buckets_ptr)0x0;
    local_c8.fieldNames._M_h._M_bucket_count = 0;
    local_c8.fieldNames._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::
    unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
    ::unordered_map(&local_c8.fieldNames);
    std::pair<const_wasm::HeapType,_wasm::TypeNames>::pair<wasm::HeapType_&,_true>
              (&local_80,__x,&local_c8);
    std::
    unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
    ::insert((unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
              *)(this + 0x60),&local_80);
    std::pair<const_wasm::HeapType,_wasm::TypeNames>::~pair(&local_80);
    TypeNames::~TypeNames(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

IndexedTypeNameGenerator(T& types,
                           FallbackGenerator& fallback,
                           const std::string& prefix = "")
    : fallback(fallback) {
    for (size_t i = 0; i < types.size(); ++i) {
      names.insert({types[i], {prefix + std::to_string(i), {}}});
    }
  }